

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O2

int __thiscall ncnn::Yolov3Detection::load_param(Yolov3Detection *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  Mat MStack_a8;
  Mat local_68;
  
  iVar1 = ParamDict::get(pd,0,0x14);
  this->classes = iVar1;
  iVar1 = ParamDict::get(pd,1,5);
  this->box_num = iVar1;
  iVar1 = ParamDict::get(pd,2,1);
  this->softmax_enable = iVar1;
  fVar2 = ParamDict::get(pd,3,0.25);
  this->confidence_threshold = fVar2;
  fVar2 = ParamDict::get(pd,4,0.45);
  this->nms_threshold = fVar2;
  iVar1 = ParamDict::get(pd,5,0);
  this->net_width = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->net_height = iVar1;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&MStack_a8,pd,7,&local_68);
  Mat::operator=(&this->biases,&MStack_a8);
  Mat::~Mat(&MStack_a8);
  Mat::~Mat(&local_68);
  return 0;
}

Assistant:

int Yolov3Detection::load_param(const ParamDict &pd)
{
    classes = pd.get(0, 20);
    box_num = pd.get(1, 5);
    softmax_enable = pd.get(2, 1);
    confidence_threshold = pd.get(3, 0.25f);
    nms_threshold = pd.get(4, 0.45f);
    net_width = pd.get(5, 0);
    net_height = pd.get(6, 0);
    biases = pd.get(7, Mat());
    return 0;
}